

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

char * absl::StackString(void **pcs,int n,char *buf,int maxlen,bool symbolize)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  char sym [200];
  undefined1 local_f8 [200];
  
  if (n != 0) {
    uVar4 = 0;
    iVar5 = 0;
    do {
      if (symbolize) {
        cVar1 = (*(code *)(anonymous_namespace)::symbolizer)(pcs[uVar4],local_f8,200);
        if (cVar1 == '\0') {
          local_f8[0] = 0;
        }
        pcVar3 = "";
        if (uVar4 == 0) {
          pcVar3 = "\n";
        }
        snprintf(buf + iVar5,(long)(maxlen - iVar5),"%s\t@ %p %s\n",pcVar3,pcs[uVar4],local_f8);
      }
      else {
        snprintf(buf + iVar5,(long)(maxlen - iVar5)," %p",pcs[uVar4]);
      }
      sVar2 = strlen(buf + iVar5);
      iVar5 = iVar5 + (int)sVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  return buf;
}

Assistant:

static char *StackString(void **pcs, int n, char *buf, int maxlen,
                         bool symbolize) {
  static const int kSymLen = 200;
  char sym[kSymLen];
  int len = 0;
  for (int i = 0; i != n; i++) {
    if (symbolize) {
      if (!symbolizer(pcs[i], sym, kSymLen)) {
        sym[0] = '\0';
      }
      snprintf(buf + len, maxlen - len, "%s\t@ %p %s\n",
               (i == 0 ? "\n" : ""),
               pcs[i], sym);
    } else {
      snprintf(buf + len, maxlen - len, " %p", pcs[i]);
    }
    len += strlen(&buf[len]);
  }
  return buf;
}